

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

void __thiscall
cfd::TransactionContext::SignWithSchnorrPrivkeySimple
          (TransactionContext *this,OutPoint *outpoint,Privkey *privkey,SigHashType *sighash_type,
          ByteData256 *aux_rand,ByteData *annex)

{
  ByteData256 sighash;
  SchnorrSignature signature;
  SchnorrSignature local_98;
  ByteData256 local_70;
  SchnorrSignature local_58;
  
  CreateSignatureHashByTaproot
            (&local_70,this,outpoint,sighash_type,(ByteData256 *)0x0,(uint32_t *)0x0,annex);
  core::SchnorrSignature::SchnorrSignature(&local_58);
  if (aux_rand == (ByteData256 *)0x0) {
    core::SchnorrUtil::Sign(&local_98,&local_70,privkey);
    core::SchnorrSignature::operator=(&local_58,&local_98);
  }
  else {
    core::SchnorrUtil::Sign(&local_98,&local_70,privkey,aux_rand);
    core::SchnorrSignature::operator=(&local_58,&local_98);
  }
  if (local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  core::SchnorrSignature::SetSigHashType(&local_58,sighash_type);
  AddSchnorrSign(this,outpoint,&local_58,annex);
  if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TransactionContext::SignWithSchnorrPrivkeySimple(
    const OutPoint& outpoint, const Privkey& privkey,
    const SigHashType& sighash_type, const ByteData256* aux_rand,
    const ByteData* annex) {
  auto sighash =
      CreateSignatureHashByTaproot(outpoint, sighash_type, nullptr, 0, annex);
  SchnorrSignature signature;
  if (aux_rand != nullptr) {
    signature = SchnorrUtil::Sign(sighash, privkey, *aux_rand);
  } else {
    signature = SchnorrUtil::Sign(sighash, privkey);
  }
  signature.SetSigHashType(sighash_type);
  AddSchnorrSign(outpoint, signature, annex);
}